

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::JavascriptLibrary::CreateNonProfiledFunction(JavascriptLibrary *this,FunctionInfo *functionInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  RuntimeFunction *this_00;
  JavascriptMethod entrypoint;
  DynamicType *type;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((functionInfo->attributes & DoNotProfile) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x18da,
                                "(functionInfo->GetAttributes() & FunctionInfo::DoNotProfile)",
                                "functionInfo->GetAttributes() & FunctionInfo::DoNotProfile");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&RuntimeFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x18dd;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (RuntimeFunction *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  entrypoint = FunctionInfo::GetOriginalEntryPoint(functionInfo);
  type = CreateDeferredFunctionTypeNoProfileThunk_Internal<false,true>(this,entrypoint,false);
  RuntimeFunction::RuntimeFunction(this_00,type,functionInfo);
  return &this_00->super_JavascriptFunction;
}

Assistant:

JavascriptFunction* JavascriptLibrary::CreateNonProfiledFunction(FunctionInfo * functionInfo)
    {
        Assert(functionInfo->GetAttributes() & FunctionInfo::DoNotProfile);
        return RecyclerNew(this->GetRecycler(), RuntimeFunction,
            CreateDeferredPrototypeFunctionTypeNoProfileThunk(functionInfo->GetOriginalEntryPoint()),
            functionInfo);
    }